

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O0

void __thiscall Controller::addViewPattern(Controller *this,string *name,View *view)

{
  undefined1 local_48 [8];
  ViewPattern temp;
  View *view_local;
  string *name_local;
  Controller *this_local;
  
  temp.view = view;
  ViewPattern::ViewPattern((ViewPattern *)local_48,name,view);
  std::vector<ViewPattern,_std::allocator<ViewPattern>_>::push_back
            (&views_list,(ViewPattern *)local_48);
  ViewPattern::~ViewPattern((ViewPattern *)local_48);
  return;
}

Assistant:

void Controller::addViewPattern(const string &name, View *view) {
    ViewPattern temp = ViewPattern(name, view);
    views_list.push_back(temp);
}